

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

void * rw::d3d9::driverOpen(void *o,int32 param_2,int32 param_3)

{
  ObjPipeline *pOVar1;
  int32 param_2_local;
  int32 param_1_local;
  void *o_local;
  
  pOVar1 = makeDefaultPipeline();
  **(undefined8 **)(engine + 0xa0) = pOVar1;
  *(undefined4 *)(*(long *)(engine + 0xa0) + 8) = d3d::nativeRasterOffset;
  *(code **)(*(long *)(engine + 0xa0) + 0x10) = d3d::rasterCreate;
  *(code **)(*(long *)(engine + 0xa0) + 0x18) = d3d::rasterLock;
  *(code **)(*(long *)(engine + 0xa0) + 0x20) = d3d::rasterUnlock;
  *(code **)(*(long *)(engine + 0xa0) + 0x38) = d3d::rasterNumLevels;
  *(code **)(*(long *)(engine + 0xa0) + 0x40) = d3d::imageFindRasterFormat;
  *(code **)(*(long *)(engine + 0xa0) + 0x48) = d3d::rasterFromImage;
  *(code **)(*(long *)(engine + 0xa0) + 0x50) = d3d::rasterToImage;
  return o;
}

Assistant:

static void*
driverOpen(void *o, int32, int32)
{
#ifdef RW_D3D9
	createDefaultShaders();
#endif
	engine->driver[PLATFORM_D3D9]->defaultPipeline = makeDefaultPipeline();

	engine->driver[PLATFORM_D3D9]->rasterNativeOffset = nativeRasterOffset;
	engine->driver[PLATFORM_D3D9]->rasterCreate       = rasterCreate;
	engine->driver[PLATFORM_D3D9]->rasterLock         = rasterLock;
	engine->driver[PLATFORM_D3D9]->rasterUnlock       = rasterUnlock;
	engine->driver[PLATFORM_D3D9]->rasterNumLevels    = rasterNumLevels;
	engine->driver[PLATFORM_D3D9]->imageFindRasterFormat = imageFindRasterFormat;
	engine->driver[PLATFORM_D3D9]->rasterFromImage    = rasterFromImage;
	engine->driver[PLATFORM_D3D9]->rasterToImage      = rasterToImage;
	return o;
}